

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

uint32_t __thiscall Instance::makespan(Instance *this)

{
  bool bVar1;
  bool bVar2;
  Z3_lbool ZVar3;
  expr *n;
  iterator iVar4;
  reference ppEVar5;
  reference this_00;
  reference pvVar6;
  long in_RDI;
  Edge *edge;
  iterator __end3;
  iterator __begin3;
  vector<Edge_*,_std::allocator<Edge_*>_> *__range3;
  size_t time;
  bool reachedGoal;
  uint32_t travel_time;
  Train train;
  iterator __end1;
  iterator __begin1;
  vector<Train,_std::allocator<Train>_> *__range1;
  uint32_t make_span;
  model m;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Train *in_stack_ffffffffffffff00;
  Train *this_01;
  Train *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  ast_vector_tpl<z3::expr> *in_stack_ffffffffffffff28;
  model *this_02;
  uint local_98;
  uint local_88;
  uint local_78;
  __normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> local_30;
  long local_28;
  uint32_t local_1c;
  
  z3::optimize::get_model((optimize *)in_stack_ffffffffffffff18);
  local_1c = 0;
  local_28 = in_RDI + 0x120;
  local_30._M_current =
       (Train *)std::vector<Train,_std::allocator<Train>_>::begin
                          ((vector<Train,_std::allocator<Train>_> *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::vector<Train,_std::allocator<Train>_>::end
            ((vector<Train,_std::allocator<Train>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>
                             *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)), bVar1
        ) {
    __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>::operator*
              (&local_30);
    Train::Train((Train *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
    local_98 = 0;
    bVar1 = false;
    for (this_02 = (model *)0x0; this_02 < (model *)(ulong)*(uint *)(in_RDI + 0x138);
        this_02 = (model *)((long)&(this_02->super_object).m_ctx + 1)) {
      if (((model *)(ulong)local_78 <= this_02) && (!bVar1)) {
        local_98 = local_98 + 1;
        n = (expr *)(in_RDI + 0x108);
        iVar4 = std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                  ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                                   *)in_stack_ffffffffffffff00,
                                  (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
              bVar2) {
          ppEVar5 = __gnu_cxx::
                    __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                    operator*((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                               *)&stack0xffffffffffffff48);
          this_01 = (Train *)*ppEVar5;
          this_00 = std::
                    vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                    ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                  *)(in_RDI + 0x158),(ulong)local_88);
          std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
          ::operator[](this_00,(size_type)this_02);
          z3::ast_vector_tpl<z3::expr>::operator[]
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
          z3::model::eval(this_02,n,SUB81((ulong)iVar4._M_current >> 0x38,0));
          ZVar3 = z3::expr::bool_value((expr *)in_stack_ffffffffffffff00);
          z3::expr::~expr((expr *)0x107ced);
          z3::expr::~expr((expr *)0x107cf7);
          if (ZVar3 == Z3_L_TRUE) {
            pvVar6 = std::vector<Stop,_std::allocator<Stop>_>::back
                               ((vector<Stop,_std::allocator<Stop>_> *)this_01);
            bVar1 = this_01 == (Train *)pvVar6->stopEdge;
            in_stack_ffffffffffffff00 = this_01;
          }
          __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
          operator++((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                     &stack0xffffffffffffff48);
        }
      }
    }
    if (local_1c < local_98) {
      local_1c = local_98;
    }
    Train::~Train(in_stack_ffffffffffffff00);
    __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>::operator++
              (&local_30);
  }
  z3::model::~model((model *)in_stack_ffffffffffffff00);
  return local_1c;
}

Assistant:

uint32_t Instance::makespan() {
  model m = solver.get_model();
  uint32_t make_span = 0;
  for (Train train : trains) {
    uint32_t travel_time = 0;
    bool reachedGoal = false;
    for (size_t time = 0; time < maxTimeSteps; time++) {
      if(time < train.start.arrivalTime || reachedGoal){
        continue;
      }
      travel_time++;
      for (Edge *edge : graph.edges) {
        if (m.eval(occupiedVars[train.id][time][edge->id], false)
                .bool_value() == Z3_TRUE) {
          reachedGoal = edge == train.stops.back().stopEdge;
        }
      }
    }
    if(travel_time > make_span)
      make_span = travel_time;
  }
  return make_span;
}